

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O3

string * cmSystemTools::EncodeURL(string *__return_storage_ptr__,string *in,bool escapeSlashes)

{
  byte bVar1;
  size_type sVar2;
  pointer pcVar3;
  uint uVar4;
  undefined7 in_register_00000011;
  size_type sVar5;
  char hexCh [4];
  uint local_40;
  undefined4 local_3c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_38;
  
  local_3c = (undefined4)CONCAT71(in_register_00000011,escapeSlashes);
  local_38 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_38;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  sVar2 = in->_M_string_length;
  if (sVar2 != 0) {
    pcVar3 = (in->_M_dataplus)._M_p;
    sVar5 = 0;
    do {
      bVar1 = pcVar3[sVar5];
      local_40 = (uint)bVar1;
      uVar4 = bVar1 - 0x20;
      if (uVar4 < 0x3d) {
        if ((0x10000000a0000861U >> ((ulong)uVar4 & 0x3f) & 1) == 0) {
          if (((ulong)uVar4 == 0xf) && ((char)local_3c != '\0')) {
            local_40 = 0x463225;
          }
        }
        else {
          snprintf((char *)&local_40,4,"%%%02X");
        }
      }
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      sVar5 = sVar5 + 1;
    } while (sVar2 != sVar5);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmSystemTools::EncodeURL(std::string const& in, bool escapeSlashes)
{
  std::string out;
  for (char c : in) {
    char hexCh[4] = { 0, 0, 0, 0 };
    hexCh[0] = c;
    switch (c) {
      case '+':
      case '?':
      case '\\':
      case '&':
      case ' ':
      case '=':
      case '%':
        snprintf(hexCh, sizeof(hexCh), "%%%02X", static_cast<int>(c));
        break;
      case '/':
        if (escapeSlashes) {
          strcpy(hexCh, "%2F");
        }
        break;
      default:
        break;
    }
    out.append(hexCh);
  }
  return out;
}